

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datablobsource.c
# Opt level: O1

void HandleBlobCallback(hrgls_DataBlob blob,void *userData)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  char *__format;
  uint32_t size;
  uint8_t *data;
  undefined1 local_24 [4];
  undefined1 local_20 [8];
  
  iVar1 = hrgls_DataBlobGetData(blob,local_20,local_24);
  if (iVar1 == 0) {
    HandleBlobCallback::count = HandleBlobCallback::count + 1;
    if (9 < HandleBlobCallback::count) {
      *(undefined1 *)userData = 1;
    }
    iVar1 = hrgls_DataBlobReleaseData(blob);
    if (iVar1 != 0) {
      HandleBlobCallback_cold_1();
    }
    iVar1 = hrgls_DataBlobDestroy(blob);
    if (iVar1 == 0) {
      return;
    }
    __format = "Could not get destroy blob: %s\n";
  }
  else {
    __format = "Could not get blob data and size in callback: %s\n";
  }
  __stream = _stderr;
  uVar2 = hrgls_ErrorMessage(iVar1);
  fprintf(__stream,__format,uVar2);
  *(undefined1 *)userData = 1;
  return;
}

Assistant:

void HandleBlobCallback(hrgls_DataBlob const blob, void *userData)
{
  // Set *done when it is time to quit.
  bool *done = (bool*)(userData);

  // Get the data pointer and its size from the blob.
  const uint8_t  *data;
  uint32_t size;
  hrgls_Status status = hrgls_DataBlobGetData(blob, &data, &size);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not get blob data and size in callback: %s\n",
      hrgls_ErrorMessage(status));
    *done = true;
    return;
  }

  // Do whatever we want with the blob.
  /// @todo Replace this code with whatever is desired.
  static size_t count = 0;
  if (++count >= 10) {
    *done = true;
  }

  // Release the data from the blob.
  status = hrgls_DataBlobReleaseData(blob);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not get blob data and size in callback: %s\n",
      hrgls_ErrorMessage(status));
    *done = true;
  }

  // In the C interface, we always need to destroy the blob that
  // was returned to us.
  status = hrgls_DataBlobDestroy(blob);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not get destroy blob: %s\n", hrgls_ErrorMessage(status));
    *done = true;
  }
}